

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

ethash_io_rc
ethash_io_prepare(char *dirname,ethash_h256_t seedhash,FILE **output_file,uint64_t file_size,
                 _Bool force_create)

{
  _Bool _Var1;
  int iVar2;
  int *piVar3;
  char *__ptr;
  size_t sVar4;
  byte in_CL;
  char *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  size_t *in_stack_00000010;
  uint64_t magic_num;
  size_t found_size;
  FILE *f;
  char *tmpfile;
  ethash_io_rc ret;
  char mutable_name [34];
  char *in_stack_ffffffffffffff80;
  char *file_name;
  ethash_h256_t *seed_hash;
  undefined4 in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  FILE *local_60;
  ethash_io_rc local_4c;
  char local_48 [47];
  byte local_19;
  char *local_18;
  undefined8 *local_10;
  char *local_8;
  
  seed_hash = (ethash_h256_t *)&stack0x00000008;
  local_19 = in_CL & 1;
  local_4c = ETHASH_IO_FAIL;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  piVar3 = __errno_location();
  *piVar3 = 0;
  _Var1 = ethash_mkdir(in_stack_ffffffffffffff80);
  if (!_Var1) {
    return ETHASH_IO_FAIL;
  }
  ethash_io_mutable_name(in_stack_ffffffffffffff94,seed_hash,in_stack_ffffffffffffff80);
  file_name = local_48;
  strlen(local_48);
  __ptr = ethash_io_create_filename
                    (in_stack_ffffffffffffff98,
                     (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (size_t)seed_hash);
  if (__ptr == (char *)0x0) {
    return ETHASH_IO_FAIL;
  }
  if (((local_19 & 1) == 0) &&
     (local_60 = (FILE *)ethash_fopen(file_name,local_8), local_60 != (FILE *)0x0)) {
    _Var1 = ethash_file_size((FILE *)magic_num,in_stack_00000010);
    if (!_Var1) {
      fclose(local_60);
      goto LAB_001541fe;
    }
    if (local_18 != in_stack_ffffffffffffff98 + -8) {
      fclose(local_60);
      local_4c = ETHASH_IO_MEMO_SIZE_MISMATCH;
      goto LAB_001541fe;
    }
    sVar4 = fread(&stack0xffffffffffffff90,8,1,local_60);
    if (sVar4 != 1) {
      fclose(local_60);
      local_4c = ETHASH_IO_MEMO_SIZE_MISMATCH;
      goto LAB_001541fe;
    }
    if (CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90) != -0x11e215245223502) {
      fclose(local_60);
      local_4c = ETHASH_IO_MEMO_SIZE_MISMATCH;
      goto LAB_001541fe;
    }
    local_4c = ETHASH_IO_MEMO_MATCH;
  }
  else {
    local_60 = (FILE *)ethash_fopen(file_name,local_8);
    if (local_60 == (FILE *)0x0) goto LAB_001541fe;
    iVar2 = fseek(local_60,(long)(local_18 + 7),0);
    if (iVar2 != 0) {
      fclose(local_60);
      goto LAB_001541fe;
    }
    iVar2 = fputc(10,local_60);
    if (iVar2 == -1) {
      fclose(local_60);
      goto LAB_001541fe;
    }
    iVar2 = fflush(local_60);
    if (iVar2 != 0) {
      fclose(local_60);
      goto LAB_001541fe;
    }
    local_4c = ETHASH_IO_MEMO_MISMATCH;
  }
  *local_10 = local_60;
LAB_001541fe:
  free(__ptr);
  return local_4c;
}

Assistant:

enum ethash_io_rc ethash_io_prepare(
	char const* dirname,
	ethash_h256_t const seedhash,
	FILE** output_file,
	uint64_t file_size,
	bool force_create
)
{
	char mutable_name[DAG_MUTABLE_NAME_MAX_SIZE];
	enum ethash_io_rc ret = ETHASH_IO_FAIL;
	// reset errno before io calls
	errno = 0;

	// assert directory exists
	if (!ethash_mkdir(dirname)) {
		ETHASH_CRITICAL("Could not create the ethash directory");
		goto end;
	}

	ethash_io_mutable_name(ETHASH_REVISION, &seedhash, mutable_name);
	char* tmpfile = ethash_io_create_filename(dirname, mutable_name, strlen(mutable_name));
	if (!tmpfile) {
		ETHASH_CRITICAL("Could not create the full DAG pathname");
		goto end;
	}

	FILE *f;
	if (!force_create) {
		// try to open the file
		f = ethash_fopen(tmpfile, "rb+");
		if (f) {
			size_t found_size;
			if (!ethash_file_size(f, &found_size)) {
				fclose(f);
				ETHASH_CRITICAL("Could not query size of DAG file: \"%s\"", tmpfile);
				goto free_memo;
			}
			if (file_size != found_size - ETHASH_DAG_MAGIC_NUM_SIZE) {
				fclose(f);
				ret = ETHASH_IO_MEMO_SIZE_MISMATCH;
				goto free_memo;
			}
			// compare the magic number, no need to care about endianess since it's local
			uint64_t magic_num;
			if (fread(&magic_num, ETHASH_DAG_MAGIC_NUM_SIZE, 1, f) != 1) {
				// I/O error
				fclose(f);
				ETHASH_CRITICAL("Could not read from DAG file: \"%s\"", tmpfile);
				ret = ETHASH_IO_MEMO_SIZE_MISMATCH;
				goto free_memo;
			}
			if (magic_num != ETHASH_DAG_MAGIC_NUM) {
				fclose(f);
				ret = ETHASH_IO_MEMO_SIZE_MISMATCH;
				goto free_memo;
			}
			ret = ETHASH_IO_MEMO_MATCH;
			goto set_file;
		}
	}
	
	// file does not exist, will need to be created
	f = ethash_fopen(tmpfile, "wb+");
	if (!f) {
		ETHASH_CRITICAL("Could not create DAG file: \"%s\"", tmpfile);
		goto free_memo;
	}
	// make sure it's of the proper size
	if (fseek(f, (long int)(file_size + ETHASH_DAG_MAGIC_NUM_SIZE - 1), SEEK_SET) != 0) {
		fclose(f);
		ETHASH_CRITICAL("Could not seek to the end of DAG file: \"%s\". Insufficient space?", tmpfile);
		goto free_memo;
	}
	if (fputc('\n', f) == EOF) {
		fclose(f);
		ETHASH_CRITICAL("Could not write in the end of DAG file: \"%s\". Insufficient space?", tmpfile);
		goto free_memo;
	}
	if (fflush(f) != 0) {
		fclose(f);
		ETHASH_CRITICAL("Could not flush at end of DAG file: \"%s\". Insufficient space?", tmpfile);
		goto free_memo;
	}
	ret = ETHASH_IO_MEMO_MISMATCH;
	goto set_file;

	ret = ETHASH_IO_MEMO_MATCH;
set_file:
	*output_file = f;
free_memo:
	free(tmpfile);
end:
	return ret;
}